

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int find_bracket(char **string)

{
  int iVar1;
  char **string_00;
  undefined8 *in_RDI;
  char *tstr;
  
  string_00 = (char **)*in_RDI;
  while( true ) {
    if (*(char *)string_00 == '\0') {
      return 1;
    }
    if (*(char *)string_00 == ']') break;
    if (*(char *)string_00 == '(') {
      string_00 = (char **)((long)string_00 + 1);
      iVar1 = find_paren(string_00);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*(char *)string_00 == '[') {
      string_00 = (char **)((long)string_00 + 1);
      iVar1 = find_bracket(string_00);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*(char *)string_00 == '{') {
      string_00 = (char **)((long)string_00 + 1);
      iVar1 = find_curlybracket(string_00);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*(char *)string_00 == '\"') {
      string_00 = (char **)((long)string_00 + 1);
      iVar1 = find_doublequote((char **)&stack0xffffffffffffffe8);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*(char *)string_00 == '\'') {
      string_00 = (char **)((long)string_00 + 1);
      iVar1 = find_quote((char **)&stack0xffffffffffffffe8);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      string_00 = (char **)((long)string_00 + 1);
    }
  }
  *in_RDI = (char *)((long)string_00 + 1);
  return 0;
}

Assistant:

static int find_bracket(char **string)

/*  
    look for the closing bracket character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {
        if (*tstr == ']') { /* found the closing bracket */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}